

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphics_threaded.cpp
# Opt level: O2

void __thiscall
CGraphics_Threaded::ReadBackbuffer
          (CGraphics_Threaded *this,uchar **ppPixels,int x,int y,int w,int h)

{
  long lVar1;
  long in_FS_OFFSET;
  CScreenshotCommand Cmd;
  CImageInfo Image;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (ppPixels != (uchar **)0x0) {
    mem_zero(&Image,0x18);
    Cmd.super_CCommand.m_Cmd = 10;
    Cmd.super_CCommand.m_pNext = (CCommand *)0x0;
    Cmd.m_pImage = &Image;
    Cmd.m_X = x;
    Cmd.m_Y = y;
    Cmd.m_W = w;
    Cmd.m_H = h;
    CCommandBuffer::AddCommand<CCommandBuffer::CScreenshotCommand>(this->m_pCommandBuffer,&Cmd);
    KickCommandBuffer(this);
    (**(code **)(*(long *)this + 0x150))(this);
    *ppPixels = (uchar *)Image.m_pData;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CGraphics_Threaded::ReadBackbuffer(unsigned char **ppPixels, int x, int y, int w, int h)
{
	if(!ppPixels)
		return;

	// add swap command
	CImageInfo Image;
	mem_zero(&Image, sizeof(Image));

	CCommandBuffer::CScreenshotCommand Cmd;
	Cmd.m_pImage = &Image;
	Cmd.m_X = x; Cmd.m_Y = y;
	Cmd.m_W = w; Cmd.m_H = h;
	m_pCommandBuffer->AddCommand(Cmd);

	// kick the buffer and wait for the result
	KickCommandBuffer();
	WaitForIdle();

	*ppPixels = (unsigned char *)Image.m_pData; // take ownership!
}